

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importPBRT.cpp
# Opt level: O3

SP __thiscall pbrt::importPBRT(pbrt *this,string *fileName,string *basePath)

{
  element_type *peVar1;
  element_type *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  runtime_error *this_01;
  long *plVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  long lVar10;
  element_type *peVar11;
  bool bVar12;
  SP SVar13;
  SP *scene;
  SP local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  SP local_200;
  SP local_1f0;
  SP local_1e0;
  SP local_1d0;
  SP local_1c0;
  SP local_1b0;
  SP local_1a0;
  SP local_190;
  SP local_180;
  undefined1 local_170 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_158;
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Texture>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
  local_150;
  _Rb_tree<std::shared_ptr<pbrt::syntactic::LightSource>,_std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
  local_120;
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Material>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Material>,_std::shared_ptr<pbrt::Material>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Material>,_std::shared_ptr<pbrt::Material>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Material>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Material>,_std::shared_ptr<pbrt::Material>_>_>_>
  local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_c0;
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Object>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
  local_90;
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Shape>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
  local_60;
  
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,".pbrt","");
  std::__cxx11::string::substr((ulong)local_170,(ulong)fileName);
  uVar2 = local_170._0_8_;
  if (local_170._8_8_ == local_220._M_string_length) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar12 = true;
    }
    else {
      iVar6 = bcmp((void *)local_170._0_8_,local_220._M_dataplus._M_p,local_170._8_8_);
      bVar12 = iVar6 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  if ((element_type *)uVar2 != (element_type *)(local_170 + 0x10)) {
    operator_delete((void *)uVar2,
                    (ulong)((long)&((__shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>
                                     *)local_170._16_8_)->_M_ptr + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if (!bVar12) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_220,"could not detect input file format!? (unknown extension in \'",
                   fileName);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
    local_170._0_8_ = *plVar7;
    peVar8 = (element_type *)(plVar7 + 2);
    if ((element_type *)local_170._0_8_ == peVar8) {
      local_170._16_8_ = ((Entity *)&peVar8->_vptr_Scene)->_vptr_Entity;
      _Stack_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[3];
      local_170._0_8_ = (element_type *)(local_170 + 0x10);
    }
    else {
      local_170._16_8_ = ((Entity *)&peVar8->_vptr_Scene)->_vptr_Entity;
    }
    local_170._8_8_ = plVar7[1];
    *plVar7 = (long)peVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(this_01,(string *)local_170);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  syntactic::Scene::parse((Scene *)local_170,fileName,basePath);
  uVar4 = local_170._8_8_;
  uVar2 = local_170._0_8_;
  local_180.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_170._0_8_;
  local_180.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_170._8_8_ + 8) = *(_Atomic_word *)(local_170._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_170._8_8_ + 8) = *(_Atomic_word *)(local_170._8_8_ + 8) + 1;
    }
  }
  local_228 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_;
  SemanticParser::SemanticParser((SemanticParser *)local_170,&local_180);
  uVar5 = local_170._8_8_;
  uVar3 = local_170._0_8_;
  *(undefined8 *)this = local_170._0_8_;
  local_170._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)(this + 8) = uVar5;
  local_170._0_8_ = (element_type *)0x0;
  std::
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Shape>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Object>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Material>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Material>,_std::shared_ptr<pbrt::Material>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Material>,_std::shared_ptr<pbrt::Material>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Material>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Material>,_std::shared_ptr<pbrt::Material>_>_>_>
  ::~_Rb_tree(&local_f0);
  std::
  _Rb_tree<std::shared_ptr<pbrt::syntactic::LightSource>,_std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
  ::~_Rb_tree(&local_120);
  std::
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Texture>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
  ::~_Rb_tree(&local_150);
  if (_Stack_158._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_158._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
  }
  if (local_180.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_190.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar3;
  local_190.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar5 + 8) = *(_Atomic_word *)(uVar5 + 8) + 1;
    }
  }
  local_1a0.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  local_1a0.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar4 + 8) = *(_Atomic_word *)(uVar4 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar4 + 8) = *(_Atomic_word *)(uVar4 + 8) + 1;
    }
  }
  createFilm(&local_190,&local_1a0);
  if (local_1a0.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_190.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_1b0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)this;
  local_1b0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_1b0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1b0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1b0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1b0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1b0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_1c0.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  local_1c0.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar4 + 8) = *(_Atomic_word *)(uVar4 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar4 + 8) = *(_Atomic_word *)(uVar4 + 8) + 1;
    }
  }
  createSampler(&local_1b0,&local_1c0);
  if (local_1c0.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c0.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1b0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_1d0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)this;
  local_1d0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_1d0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1d0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1d0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1d0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1d0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_1e0.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  local_1e0.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar4 + 8) = *(_Atomic_word *)(uVar4 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar4 + 8) = *(_Atomic_word *)(uVar4 + 8) + 1;
    }
  }
  createIntegrator(&local_1d0,&local_1e0);
  if (local_1e0.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e0.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1d0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_1f0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)this;
  local_1f0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_1f0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1f0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1f0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1f0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1f0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_200.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  local_200.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar4 + 8) = *(_Atomic_word *)(uVar4 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar4 + 8) = *(_Atomic_word *)(uVar4 + 8) + 1;
    }
  }
  createPixelFilter(&local_1f0,&local_200);
  _Var9._M_pi = extraout_RDX;
  if (local_200.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_200.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var9._M_pi = extraout_RDX_00;
  }
  if (local_1f0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f0.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_01;
  }
  peVar11 = (element_type *)
            (((vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
               *)(uVar2 + 8))->
            super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  peVar1 = (element_type *)
           ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
           &(((vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
               *)(uVar2 + 8))->
            super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
            )._M_impl.super__Vector_impl_data._M_finish)->_M_pi;
  if (peVar11 != peVar1) {
    do {
      local_238.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)peVar11->_vptr_Entity;
      this_00 = (peVar11->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (this_00 == (element_type *)0x0) {
        lVar10 = *(long *)this;
        local_238.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_238.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this =
               *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this + 1;
          UNLOCK();
          lVar10 = *(long *)this;
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this =
                 *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this + 1;
            UNLOCK();
            goto LAB_00122533;
          }
        }
        else {
          *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this =
               *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this + 1;
          lVar10 = *(long *)this;
        }
        *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this =
             *(int *)&(this_00->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this + 1;
      }
LAB_00122533:
      createCamera((pbrt *)local_170,&local_238);
      std::vector<std::shared_ptr<pbrt::Camera>,std::allocator<std::shared_ptr<pbrt::Camera>>>::
      emplace_back<std::shared_ptr<pbrt::Camera>>
                ((vector<std::shared_ptr<pbrt::Camera>,std::allocator<std::shared_ptr<pbrt::Camera>>>
                  *)(lVar10 + 0x18),(shared_ptr<pbrt::Camera> *)local_170);
      _Var9._M_pi = extraout_RDX_02;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
        _Var9._M_pi = extraout_RDX_03;
      }
      if ((element_type *)
          local_238.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_238.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        _Var9._M_pi = extraout_RDX_04;
      }
      if (this_00 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        _Var9._M_pi = extraout_RDX_05;
      }
      peVar11 = (element_type *)
                &(peVar11->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                 super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    } while (peVar11 != peVar1);
  }
  if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
    _Var9._M_pi = extraout_RDX_06;
  }
  SVar13.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var9._M_pi
  ;
  SVar13.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar13.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Scene::SP importPBRT(const std::string &fileName, const std::string &basePath)
  {
    pbrt::syntactic::Scene::SP pbrt;
    if (endsWith(fileName,".pbrt"))
      pbrt = pbrt::syntactic::Scene::parse(fileName, basePath);
    else
      throw std::runtime_error("could not detect input file format!? (unknown extension in '"+fileName+"')");
      
    Scene::SP scene = SemanticParser(pbrt).result;
    createFilm(scene,pbrt);
    createSampler(scene,pbrt);
    createIntegrator(scene,pbrt);
    createPixelFilter(scene,pbrt);
    for (auto cam : pbrt->cameras)
      scene->cameras.push_back(createCamera(cam));
    return scene;
  }